

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::DataTable
          (DataTable *this,ClientContext *context,DataTable *parent,BoundConstraint *constraint)

{
  mutex *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pIVar2;
  pointer pcVar3;
  pointer pCVar4;
  int iVar5;
  DataTableInfo *pDVar6;
  DuckTransaction *this_00;
  LocalStorage *this_01;
  pointer this_02;
  DataTable *this_03;
  pointer pIVar7;
  undefined1 local_108 [32];
  undefined1 local_e8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __node_base local_d0;
  size_type sStack_c8;
  float local_c0;
  size_t local_b8;
  undefined1 auStack_b0 [8];
  undefined1 local_a8 [24];
  undefined1 auStack_90 [24];
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->db = parent->db;
  (this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (parent->info).internal.
         super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (parent->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__align = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->row_groups).internal.
       super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (parent->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->version)._M_i = MAIN_TABLE;
  pDVar6 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&parent->info);
  pIVar7 = (pDVar6->index_storage_infos).
           super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pDVar6->index_storage_infos).
           super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar2) {
    do {
      pDVar6 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
      pcVar3 = (pIVar7->name)._M_dataplus._M_p;
      local_108._0_8_ = (DataTable *)(local_108 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar3,pcVar3 + (pIVar7->name)._M_string_length);
      local_e8._8_8_ = auStack_b0;
      local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
      local_d0._M_nxt = (_Hash_node_base *)0x0;
      sStack_c8 = 0;
      local_c0 = 1.0;
      auStack_90._8_8_ = (pointer)0x0;
      auStack_90._16_8_ = (pointer)0x0;
      local_a8._16_8_ = (pointer)0x0;
      auStack_90._0_8_ = (pointer)0x0;
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_b8 = 0;
      auStack_b0 = (undefined1  [8])0x0;
      local_78 = (element_type *)0xffffffffffffffff;
      local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::
      emplace_back<duckdb::IndexStorageInfo>
                (&(pDVar6->index_storage_infos).
                  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>,
                 (IndexStorageInfo *)local_108);
      ::std::
      vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
      ::~vector((vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
                 *)auStack_90);
      ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ::~vector((vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                 *)local_a8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_e8 + 8));
      if ((DataTable *)local_108._0_8_ != (DataTable *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar2);
  }
  pDVar6 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  TableIndexList::InitializeIndexes(&pDVar6->indexes,context,pDVar6,(char *)0x0);
  this_00 = DuckTransaction::Get(context,this->db);
  this_01 = DuckTransaction::GetLocalStorage(this_00);
  __mutex = &parent->append_lock;
  this_03 = (DataTable *)__mutex;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    this_02 = (parent->column_definitions).
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
              super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (parent->column_definitions).
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_02 != pCVar4) {
      do {
        ColumnDefinition::Copy((ColumnDefinition *)local_108,this_02);
        ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::
        emplace_back<duckdb::ColumnDefinition>
                  (&(this->column_definitions).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ,(ColumnDefinition *)local_108);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_68);
        Value::~Value((Value *)local_a8);
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)auStack_b0 !=
            (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
          (*(code *)((_Hash_node_base *)((BaseExpression *)auStack_b0)->_vptr_BaseExpression)[1].
                    _M_nxt)();
        }
        auStack_b0 = (undefined1  [8])0x0;
        LogicalType::~LogicalType((LogicalType *)local_e8);
        this_03 = (DataTable *)local_108._0_8_;
        if ((DataTable *)local_108._0_8_ != (DataTable *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
        this_02 = this_02 + 1;
      } while (this_02 != pCVar4);
    }
    if (constraint->type != UNIQUE) {
      VerifyNewConstraint(this_03,this_01,parent,constraint);
    }
    LocalStorage::MoveStorage(this_01,parent,this);
    LOCK();
    (parent->version)._M_i = ALTERED;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

DataTable::DataTable(ClientContext &context, DataTable &parent, BoundConstraint &constraint)
    : db(parent.db), info(parent.info), row_groups(parent.row_groups), version(DataTableVersion::MAIN_TABLE) {

	// ALTER COLUMN to add a new constraint.

	// Clone the storage info vector or the table.
	for (const auto &index_info : parent.info->index_storage_infos) {
		info->index_storage_infos.push_back(IndexStorageInfo(index_info.name));
	}
	info->InitializeIndexes(context);

	auto &local_storage = LocalStorage::Get(context, db);
	lock_guard<mutex> parent_lock(parent.append_lock);
	for (auto &column_def : parent.column_definitions) {
		column_definitions.emplace_back(column_def.Copy());
	}

	if (constraint.type != ConstraintType::UNIQUE) {
		VerifyNewConstraint(local_storage, parent, constraint);
	}
	local_storage.MoveStorage(parent, *this);
	parent.version = DataTableVersion::ALTERED;
}